

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<4,_16777232,_false,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMvMBIntersector1Moeller<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  RTCIntersectArguments *pRVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ulong *puVar24;
  long lVar25;
  byte bVar26;
  uint uVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  uint uVar29;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  ulong uVar34;
  ulong uVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [64];
  undefined1 auVar62 [16];
  undefined1 auVar63 [64];
  undefined1 auVar64 [16];
  float fVar65;
  float fVar67;
  float fVar68;
  undefined1 auVar66 [16];
  float fVar69;
  undefined4 uVar70;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  uint uVar73;
  uint uVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 in_ZMM29 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<4> tNear;
  StackItemT<embree::NodeRefPtr<4>_> stack [244];
  uint local_117c;
  int local_1154;
  long local_1150;
  long local_1148;
  ulong local_1140;
  ulong local_1138;
  RayQueryContext *local_1130;
  Geometry *local_1128;
  Scene *local_1120;
  RTCFilterFunctionNArguments local_1118;
  float local_10e8;
  undefined4 local_10e4;
  undefined4 local_10e0;
  undefined4 local_10dc;
  undefined4 local_10d8;
  undefined4 local_10d4;
  uint local_10d0;
  uint local_10cc;
  uint local_10c8;
  undefined1 local_10b8 [16];
  undefined1 local_10a8 [16];
  undefined1 local_1098 [16];
  undefined1 local_1088 [16];
  undefined1 local_1078 [16];
  undefined1 local_1068 [16];
  undefined1 local_1058 [16];
  undefined1 local_1048 [16];
  undefined1 local_1038 [16];
  undefined1 local_1028 [16];
  undefined1 local_1018 [16];
  undefined1 local_1008 [16];
  undefined1 local_ff8 [16];
  byte local_fe7;
  float local_fd8 [4];
  float local_fc8 [4];
  undefined1 local_fb8 [16];
  undefined1 local_fa8 [16];
  undefined1 local_f98 [16];
  undefined1 local_f88 [16];
  ulong local_f78;
  undefined4 uStack_f70;
  ulong local_f68 [487];
  ulong uVar30;
  
  local_f78 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_f78 != 8) {
    local_1130 = context;
    puVar24 = local_f68;
    aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar39 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]))
    ;
    fVar65 = (ray->super_RayK<1>).tfar;
    auVar63 = ZEXT464((uint)fVar65);
    uStack_f70 = 0;
    auVar40 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)fVar65));
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx512vl((undefined1  [16])aVar2,auVar36);
    auVar52._8_4_ = 0x219392ef;
    auVar52._0_8_ = 0x219392ef219392ef;
    auVar52._12_4_ = 0x219392ef;
    uVar33 = vcmpps_avx512vl(auVar36,auVar52,1);
    bVar6 = (bool)((byte)uVar33 & 1);
    auVar38._0_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.x;
    bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
    auVar38._4_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.y;
    bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
    auVar38._8_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * (int)aVar2.z;
    bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
    auVar38._12_4_ = (uint)bVar6 * 0x219392ef | (uint)!bVar6 * aVar2.field_3.a;
    auVar36 = vrcp14ps_avx512vl(auVar38);
    auVar37._8_4_ = 0x3f800000;
    auVar37._0_8_ = 0x3f8000003f800000;
    auVar37._12_4_ = 0x3f800000;
    auVar37 = vfnmadd213ps_avx512vl(auVar38,auVar36,auVar37);
    auVar51 = vfmadd132ps_fma(auVar37,auVar36,auVar36);
    auVar36 = vbroadcastss_avx512vl(auVar51);
    auVar77 = ZEXT1664(auVar36);
    auVar36 = vmovshdup_avx(auVar51);
    auVar37 = vshufps_avx512vl(auVar51,auVar51,0x55);
    auVar78 = ZEXT1664(auVar37);
    auVar37 = vshufpd_avx(auVar51,auVar51,1);
    auVar38 = vshufps_avx512vl(auVar51,auVar51,0xaa);
    auVar79 = ZEXT1664(auVar38);
    auVar57._0_4_ = auVar51._0_4_ * (ray->super_RayK<1>).org.field_0.m128[0];
    auVar57._4_4_ = auVar51._4_4_ * (ray->super_RayK<1>).org.field_0.m128[1];
    auVar57._8_4_ = auVar51._8_4_ * (ray->super_RayK<1>).org.field_0.m128[2];
    auVar57._12_4_ = auVar51._12_4_ * (ray->super_RayK<1>).org.field_0.m128[3];
    auVar53._4_4_ = auVar57._0_4_;
    auVar53._0_4_ = auVar57._0_4_;
    auVar53._8_4_ = auVar57._0_4_;
    auVar53._12_4_ = auVar57._0_4_;
    auVar38 = vshufps_avx(auVar57,auVar57,0x55);
    auVar57 = vshufps_avx(auVar57,auVar57,0xaa);
    local_1138 = (ulong)(auVar51._0_4_ < 0.0) << 4;
    local_1140 = (ulong)(auVar36._0_4_ < 0.0) << 4 | 0x20;
    uVar35 = (ulong)(auVar37._0_4_ < 0.0) << 4 | 0x40;
    uVar33 = local_1138 ^ 0x10;
    uVar34 = local_1140 ^ 0x10;
    auVar39 = vbroadcastss_avx512vl(auVar39);
    auVar80 = ZEXT1664(auVar39);
    auVar51._8_4_ = 0x80000000;
    auVar51._0_8_ = 0x8000000080000000;
    auVar51._12_4_ = 0x80000000;
    uVar70 = auVar40._0_4_;
    auVar61 = ZEXT1664(CONCAT412(uVar70,CONCAT48(uVar70,CONCAT44(uVar70,uVar70))));
    auVar39 = vxorps_avx512vl(auVar53,auVar51);
    auVar81 = ZEXT1664(auVar39);
    auVar39 = vxorps_avx512vl(auVar38,auVar51);
    auVar82 = ZEXT1664(auVar39);
    auVar39 = vxorps_avx512vl(auVar57,auVar51);
    auVar83 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar84 = ZEXT1664(auVar39);
    auVar39 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
    auVar85 = ZEXT1664(auVar39);
    auVar39 = vxorps_avx512vl(in_ZMM29._0_16_,in_ZMM29._0_16_);
    auVar86 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar87 = ZEXT1664(auVar39);
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar88 = ZEXT1664(auVar39);
LAB_01ea46ae:
    do {
      pfVar1 = (float *)(puVar24 + -1);
      puVar24 = puVar24 + -2;
      if (*pfVar1 <= auVar63._0_4_) {
        uVar31 = *puVar24;
        while ((uVar31 & 8) == 0) {
          uVar28 = uVar31 & 0xfffffffffffffff0;
          uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar49._4_4_ = uVar70;
          auVar49._0_4_ = uVar70;
          auVar49._8_4_ = uVar70;
          auVar49._12_4_ = uVar70;
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + local_1138),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + local_1138));
          auVar40 = vfmadd213ps_avx512vl(auVar39,auVar77._0_16_,auVar81._0_16_);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + local_1140),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + local_1140));
          auVar36 = vmaxps_avx512vl(auVar80._0_16_,auVar40);
          auVar40 = vfmadd213ps_avx512vl(auVar39,auVar78._0_16_,auVar82._0_16_);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar35),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + uVar35));
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar79._0_16_,auVar83._0_16_);
          auVar39 = vmaxps_avx(auVar40,auVar39);
          auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar33),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + uVar33));
          local_1028 = vmaxps_avx(auVar36,auVar39);
          auVar40 = vfmadd213ps_avx512vl(auVar40,auVar77._0_16_,auVar81._0_16_);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + uVar34),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + uVar34));
          auVar36 = vfmadd213ps_avx512vl(auVar39,auVar78._0_16_,auVar82._0_16_);
          auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar28 + 0x80 + (uVar35 ^ 0x10)),auVar49,
                                    *(undefined1 (*) [16])(uVar28 + 0x20 + (uVar35 ^ 0x10)));
          auVar39 = vfmadd213ps_avx512vl(auVar39,auVar79._0_16_,auVar83._0_16_);
          auVar39 = vminps_avx(auVar36,auVar39);
          auVar40 = vminps_avx(auVar61._0_16_,auVar40);
          auVar39 = vminps_avx(auVar40,auVar39);
          uVar14 = vcmpps_avx512vl(local_1028,auVar39,2);
          uVar29 = (uint)uVar14;
          if (((uint)uVar31 & 7) == 6) {
            uVar15 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(uVar28 + 0xf0),1);
            uVar16 = vcmpps_avx512vl(auVar49,*(undefined1 (*) [16])(uVar28 + 0xe0),0xd);
            uVar29 = (uint)(byte)((byte)uVar15 & (byte)uVar16 & (byte)uVar14);
          }
          if ((byte)uVar29 == 0) {
            auVar39 = vmovshdup_avx(*(undefined1 (*) [16])
                                     ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc));
            auVar63 = ZEXT1664(auVar39);
            if (puVar24 == &local_f78) {
              return;
            }
            goto LAB_01ea46ae;
          }
          lVar25 = 0;
          for (uVar31 = (ulong)(byte)uVar29; (uVar31 & 1) == 0;
              uVar31 = uVar31 >> 1 | 0x8000000000000000) {
            lVar25 = lVar25 + 1;
          }
          uVar31 = *(ulong *)(uVar28 + lVar25 * 8);
          uVar29 = (uVar29 & 0xff) - 1 & uVar29 & 0xff;
          uVar30 = (ulong)uVar29;
          if (uVar29 != 0) {
            uVar73 = *(uint *)(local_1028 + lVar25 * 4);
            lVar25 = 0;
            for (; (uVar30 & 1) == 0; uVar30 = uVar30 >> 1 | 0x8000000000000000) {
              lVar25 = lVar25 + 1;
            }
            uVar29 = uVar29 - 1 & uVar29;
            uVar32 = (ulong)uVar29;
            uVar30 = *(ulong *)(uVar28 + lVar25 * 8);
            uVar27 = *(uint *)(local_1028 + lVar25 * 4);
            if (uVar29 == 0) {
              if (uVar73 < uVar27) {
                *puVar24 = uVar30;
                *(uint *)(puVar24 + 1) = uVar27;
                puVar24 = puVar24 + 2;
              }
              else {
                *puVar24 = uVar31;
                *(uint *)(puVar24 + 1) = uVar73;
                puVar24 = puVar24 + 2;
                uVar31 = uVar30;
              }
            }
            else {
              auVar39._8_8_ = 0;
              auVar39._0_8_ = uVar31;
              auVar39 = vpunpcklqdq_avx(auVar39,ZEXT416(uVar73));
              auVar40._8_8_ = 0;
              auVar40._0_8_ = uVar30;
              auVar40 = vpunpcklqdq_avx(auVar40,ZEXT416(uVar27));
              lVar25 = 0;
              for (; (uVar32 & 1) == 0; uVar32 = uVar32 >> 1 | 0x8000000000000000) {
                lVar25 = lVar25 + 1;
              }
              uVar29 = uVar29 - 1 & uVar29;
              uVar31 = (ulong)uVar29;
              auVar50._8_8_ = 0;
              auVar50._0_8_ = *(ulong *)(uVar28 + lVar25 * 8);
              auVar57 = vpunpcklqdq_avx(auVar50,ZEXT416(*(uint *)(local_1028 + lVar25 * 4)));
              auVar36 = vpshufd_avx(auVar39,0xaa);
              auVar37 = vpshufd_avx(auVar40,0xaa);
              auVar38 = vpshufd_avx(auVar57,0xaa);
              if (uVar29 == 0) {
                uVar31 = vpcmpgtd_avx512vl(auVar37,auVar36);
                uVar31 = uVar31 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar40,auVar39);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar41._0_4_ = (uint)bVar6 * auVar37._0_4_ | (uint)!bVar6 * auVar36._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar41._4_4_ = (uint)bVar6 * auVar37._4_4_ | (uint)!bVar6 * auVar36._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar41._8_4_ = (uint)bVar6 * auVar37._8_4_ | (uint)!bVar6 * auVar36._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar41._12_4_ = (uint)bVar6 * auVar37._12_4_ | (uint)!bVar6 * auVar36._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar42._0_4_ = (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar39._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar42._4_4_ = (uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * auVar39._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar42._8_4_ = (uint)bVar6 * auVar40._8_4_ | (uint)!bVar6 * auVar39._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar42._12_4_ = (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * auVar39._12_4_;
                auVar39 = vpshufd_avx(auVar41,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar38,auVar39);
                uVar28 = uVar28 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar57,auVar41);
                bVar6 = (bool)((byte)uVar28 & 1);
                bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
                uVar31 = CONCAT44((uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar39._4_4_,
                                  (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar39._0_4_);
                auVar39 = vmovdqa32_avx512vl(auVar57);
                bVar6 = (bool)((byte)uVar28 & 1);
                auVar43._0_4_ = (uint)bVar6 * auVar39._0_4_ | !bVar6 * auVar41._0_4_;
                bVar6 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar43._4_4_ = (uint)bVar6 * auVar39._4_4_ | !bVar6 * auVar41._4_4_;
                bVar6 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar43._8_4_ = (uint)bVar6 * auVar39._8_4_ | !bVar6 * auVar41._8_4_;
                bVar6 = SUB81(uVar28 >> 3,0);
                auVar43._12_4_ = (uint)bVar6 * auVar39._12_4_ | !bVar6 * auVar41._12_4_;
                auVar39 = vpshufd_avx(auVar43,0xaa);
                auVar40 = vpshufd_avx(auVar42,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar39,auVar40);
                uVar28 = uVar28 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar43,auVar42);
                bVar6 = (bool)((byte)uVar28 & 1);
                bVar8 = (bool)((byte)(uVar28 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar28 >> 2) & 1);
                bVar12 = SUB81(uVar28 >> 3,0);
                auVar36 = vmovdqa32_avx512vl(auVar43);
                bVar7 = (bool)((byte)uVar28 & 1);
                bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                bVar11 = (bool)((byte)(uVar28 >> 2) & 1);
                bVar13 = SUB81(uVar28 >> 3,0);
                *(uint *)puVar24 = (uint)bVar7 * auVar36._0_4_ | !bVar7 * auVar42._0_4_;
                *(uint *)((long)puVar24 + 4) = (uint)bVar9 * auVar36._4_4_ | !bVar9 * auVar42._4_4_;
                *(uint *)(puVar24 + 1) = (uint)bVar11 * auVar36._8_4_ | !bVar11 * auVar42._8_4_;
                *(uint *)((long)puVar24 + 0xc) =
                     (uint)bVar13 * auVar36._12_4_ | !bVar13 * auVar42._12_4_;
                *(uint *)(puVar24 + 2) = (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar39._0_4_;
                *(uint *)((long)puVar24 + 0x14) =
                     (uint)bVar8 * auVar40._4_4_ | (uint)!bVar8 * auVar39._4_4_;
                *(uint *)(puVar24 + 3) =
                     (uint)bVar10 * auVar40._8_4_ | (uint)!bVar10 * auVar39._8_4_;
                *(uint *)((long)puVar24 + 0x1c) =
                     (uint)bVar12 * auVar40._12_4_ | (uint)!bVar12 * auVar39._12_4_;
                puVar24 = puVar24 + 4;
              }
              else {
                lVar25 = 0;
                for (; (uVar31 & 1) == 0; uVar31 = uVar31 >> 1 | 0x8000000000000000) {
                  lVar25 = lVar25 + 1;
                }
                uVar29 = *(uint *)(local_1028 + lVar25 * 4);
                auVar71._8_8_ = 0;
                auVar71._0_8_ = *(ulong *)(uVar28 + lVar25 * 8);
                auVar51 = vpunpcklqdq_avx(auVar71,ZEXT416(uVar29));
                uVar31 = vpcmpgtd_avx512vl(auVar37,auVar36);
                uVar31 = uVar31 & 0xf;
                auVar37 = vpblendmd_avx512vl(auVar40,auVar39);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar54._0_4_ = (uint)bVar6 * auVar37._0_4_ | (uint)!bVar6 * auVar36._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar54._4_4_ = (uint)bVar6 * auVar37._4_4_ | (uint)!bVar6 * auVar36._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar54._8_4_ = (uint)bVar6 * auVar37._8_4_ | (uint)!bVar6 * auVar36._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar54._12_4_ = (uint)bVar6 * auVar37._12_4_ | (uint)!bVar6 * auVar36._12_4_;
                auVar40 = vmovdqa32_avx512vl(auVar40);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar55._0_4_ = (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar39._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar55._4_4_ = (uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * auVar39._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar55._8_4_ = (uint)bVar6 * auVar40._8_4_ | (uint)!bVar6 * auVar39._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar55._12_4_ = (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * auVar39._12_4_;
                auVar66._4_4_ = uVar29;
                auVar66._0_4_ = uVar29;
                auVar66._8_4_ = uVar29;
                auVar66._12_4_ = uVar29;
                uVar31 = vpcmpgtd_avx512vl(auVar66,auVar38);
                uVar31 = uVar31 & 0xf;
                auVar39 = vpblendmd_avx512vl(auVar51,auVar57);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar56._0_4_ = (uint)bVar6 * auVar39._0_4_ | !bVar6 * uVar29;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar56._4_4_ = (uint)bVar6 * auVar39._4_4_ | !bVar6 * uVar29;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar56._8_4_ = (uint)bVar6 * auVar39._8_4_ | !bVar6 * uVar29;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar56._12_4_ = (uint)bVar6 * auVar39._12_4_ | !bVar6 * uVar29;
                auVar39 = vmovdqa32_avx512vl(auVar51);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar44._0_4_ = (uint)bVar6 * auVar39._0_4_ | (uint)!bVar6 * auVar57._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar44._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * auVar57._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar44._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * auVar57._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar44._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * auVar57._12_4_;
                auVar39 = vpshufd_avx(auVar44,0xaa);
                auVar40 = vpshufd_avx(auVar55,0xaa);
                uVar31 = vpcmpgtd_avx512vl(auVar39,auVar40);
                uVar31 = uVar31 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar44,auVar55);
                bVar6 = (bool)((byte)uVar31 & 1);
                auVar45._0_4_ = (uint)bVar6 * auVar40._0_4_ | (uint)!bVar6 * auVar39._0_4_;
                bVar6 = (bool)((byte)(uVar31 >> 1) & 1);
                auVar45._4_4_ = (uint)bVar6 * auVar40._4_4_ | (uint)!bVar6 * auVar39._4_4_;
                bVar6 = (bool)((byte)(uVar31 >> 2) & 1);
                auVar45._8_4_ = (uint)bVar6 * auVar40._8_4_ | (uint)!bVar6 * auVar39._8_4_;
                bVar6 = SUB81(uVar31 >> 3,0);
                auVar45._12_4_ = (uint)bVar6 * auVar40._12_4_ | (uint)!bVar6 * auVar39._12_4_;
                auVar36 = vmovdqa32_avx512vl(auVar44);
                bVar6 = (bool)((byte)uVar31 & 1);
                bVar8 = (bool)((byte)(uVar31 >> 1) & 1);
                bVar10 = (bool)((byte)(uVar31 >> 2) & 1);
                bVar11 = SUB81(uVar31 >> 3,0);
                auVar39 = vpshufd_avx(auVar56,0xaa);
                auVar40 = vpshufd_avx(auVar54,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar39,auVar40);
                uVar28 = uVar28 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar56,auVar54);
                bVar7 = (bool)((byte)uVar28 & 1);
                bVar9 = (bool)((byte)(uVar28 >> 1) & 1);
                uVar31 = CONCAT44((uint)bVar9 * auVar40._4_4_ | (uint)!bVar9 * auVar39._4_4_,
                                  (uint)bVar7 * auVar40._0_4_ | (uint)!bVar7 * auVar39._0_4_);
                auVar39 = vmovdqa32_avx512vl(auVar56);
                bVar7 = (bool)((byte)uVar28 & 1);
                auVar46._0_4_ = (uint)bVar7 * auVar39._0_4_ | !bVar7 * auVar54._0_4_;
                bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar46._4_4_ = (uint)bVar7 * auVar39._4_4_ | !bVar7 * auVar54._4_4_;
                bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar46._8_4_ = (uint)bVar7 * auVar39._8_4_ | !bVar7 * auVar54._8_4_;
                bVar7 = SUB81(uVar28 >> 3,0);
                auVar46._12_4_ = (uint)bVar7 * auVar39._12_4_ | !bVar7 * auVar54._12_4_;
                auVar39 = vpshufd_avx(auVar46,0xaa);
                auVar40 = vpshufd_avx(auVar45,0xaa);
                uVar28 = vpcmpgtd_avx512vl(auVar40,auVar39);
                uVar28 = uVar28 & 0xf;
                auVar40 = vpblendmd_avx512vl(auVar45,auVar46);
                bVar7 = (bool)((byte)uVar28 & 1);
                auVar47._0_4_ = (uint)bVar7 * auVar40._0_4_ | (uint)!bVar7 * auVar39._0_4_;
                bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar47._4_4_ = (uint)bVar7 * auVar40._4_4_ | (uint)!bVar7 * auVar39._4_4_;
                bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar47._8_4_ = (uint)bVar7 * auVar40._8_4_ | (uint)!bVar7 * auVar39._8_4_;
                bVar7 = SUB81(uVar28 >> 3,0);
                auVar47._12_4_ = (uint)bVar7 * auVar40._12_4_ | (uint)!bVar7 * auVar39._12_4_;
                auVar39 = vmovdqa32_avx512vl(auVar45);
                bVar7 = (bool)((byte)uVar28 & 1);
                auVar48._0_4_ = (uint)bVar7 * auVar39._0_4_ | !bVar7 * auVar46._0_4_;
                bVar7 = (bool)((byte)(uVar28 >> 1) & 1);
                auVar48._4_4_ = (uint)bVar7 * auVar39._4_4_ | !bVar7 * auVar46._4_4_;
                bVar7 = (bool)((byte)(uVar28 >> 2) & 1);
                auVar48._8_4_ = (uint)bVar7 * auVar39._8_4_ | !bVar7 * auVar46._8_4_;
                bVar7 = SUB81(uVar28 >> 3,0);
                auVar48._12_4_ = (uint)bVar7 * auVar39._12_4_ | !bVar7 * auVar46._12_4_;
                *(uint *)puVar24 = (uint)bVar6 * auVar36._0_4_ | !bVar6 * auVar55._0_4_;
                *(uint *)((long)puVar24 + 4) = (uint)bVar8 * auVar36._4_4_ | !bVar8 * auVar55._4_4_;
                *(uint *)(puVar24 + 1) = (uint)bVar10 * auVar36._8_4_ | !bVar10 * auVar55._8_4_;
                *(uint *)((long)puVar24 + 0xc) =
                     (uint)bVar11 * auVar36._12_4_ | !bVar11 * auVar55._12_4_;
                *(undefined1 (*) [16])(puVar24 + 2) = auVar48;
                *(undefined1 (*) [16])(puVar24 + 4) = auVar47;
                puVar24 = puVar24 + 6;
              }
            }
          }
        }
        local_1148 = (ulong)((uint)uVar31 & 0xf) - 8;
        if (local_1148 != 0) {
          uVar31 = uVar31 & 0xfffffffffffffff0;
          local_1150 = 0;
          do {
            lVar25 = local_1150 * 0x140;
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
            auVar59._4_4_ = uVar70;
            auVar59._0_4_ = uVar70;
            auVar59._8_4_ = uVar70;
            auVar59._12_4_ = uVar70;
            auVar51 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x90 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + lVar25));
            auVar52 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xa0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x10 + lVar25));
            auVar53 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xb0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x20 + lVar25));
            auVar39 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xc0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x30 + lVar25));
            auVar40 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xd0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x40 + lVar25));
            auVar36 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xe0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x50 + lVar25));
            auVar37 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0xf0 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x60 + lVar25));
            auVar38 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x100 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x70 + lVar25));
            auVar57 = vfmadd213ps_fma(*(undefined1 (*) [16])(uVar31 + 0x110 + lVar25),auVar59,
                                      *(undefined1 (*) [16])(uVar31 + 0x80 + lVar25));
            auVar39 = vsubps_avx(auVar51,auVar39);
            auVar40 = vsubps_avx(auVar52,auVar40);
            auVar36 = vsubps_avx(auVar53,auVar36);
            auVar37 = vsubps_avx(auVar37,auVar51);
            auVar38 = vsubps_avx(auVar38,auVar52);
            auVar57 = vsubps_avx(auVar57,auVar53);
            auVar60._0_4_ = auVar40._0_4_ * auVar57._0_4_;
            auVar60._4_4_ = auVar40._4_4_ * auVar57._4_4_;
            auVar60._8_4_ = auVar40._8_4_ * auVar57._8_4_;
            auVar60._12_4_ = auVar40._12_4_ * auVar57._12_4_;
            local_fa8 = vfmsub231ps_fma(auVar60,auVar38,auVar36);
            auVar62._0_4_ = auVar36._0_4_ * auVar37._0_4_;
            auVar62._4_4_ = auVar36._4_4_ * auVar37._4_4_;
            auVar62._8_4_ = auVar36._8_4_ * auVar37._8_4_;
            auVar62._12_4_ = auVar36._12_4_ * auVar37._12_4_;
            local_f98 = vfmsub231ps_fma(auVar62,auVar57,auVar39);
            auVar64._0_4_ = auVar39._0_4_ * auVar38._0_4_;
            auVar64._4_4_ = auVar39._4_4_ * auVar38._4_4_;
            auVar64._8_4_ = auVar39._8_4_ * auVar38._8_4_;
            auVar64._12_4_ = auVar39._12_4_ * auVar38._12_4_;
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
            auVar76._4_4_ = uVar70;
            auVar76._0_4_ = uVar70;
            auVar76._8_4_ = uVar70;
            auVar76._12_4_ = uVar70;
            auVar49 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[1]))
            ;
            auVar50 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).dir.field_0.m128[2]))
            ;
            uVar70 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar18._4_4_ = uVar70;
            auVar18._0_4_ = uVar70;
            auVar18._8_4_ = uVar70;
            auVar18._12_4_ = uVar70;
            auVar51 = vsubps_avx512vl(auVar51,auVar18);
            local_f88 = vfmsub231ps_fma(auVar64,auVar37,auVar40);
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar19._4_4_ = uVar70;
            auVar19._0_4_ = uVar70;
            auVar19._8_4_ = uVar70;
            auVar19._12_4_ = uVar70;
            auVar52 = vsubps_avx512vl(auVar52,auVar19);
            uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar20._4_4_ = uVar70;
            auVar20._0_4_ = uVar70;
            auVar20._8_4_ = uVar70;
            auVar20._12_4_ = uVar70;
            auVar53 = vsubps_avx512vl(auVar53,auVar20);
            auVar54 = vmulps_avx512vl(auVar49,auVar53);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar52,auVar50);
            auVar55 = vmulps_avx512vl(auVar50,auVar51);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar53,auVar76);
            auVar56 = vmulps_avx512vl(auVar76,auVar52);
            auVar56 = vfmsub231ps_avx512vl(auVar56,auVar51,auVar49);
            auVar50 = vmulps_avx512vl(local_f88,auVar50);
            auVar49 = vfmadd231ps_avx512vl(auVar50,local_f98,auVar49);
            auVar49 = vfmadd231ps_avx512vl(auVar49,local_fa8,auVar76);
            local_ff8 = vandps_avx512vl(auVar49,auVar84._0_16_);
            auVar57 = vmulps_avx512vl(auVar57,auVar56);
            auVar38 = vfmadd231ps_avx512vl(auVar57,auVar55,auVar38);
            auVar37 = vfmadd231ps_fma(auVar38,auVar54,auVar37);
            auVar38 = vandps_avx512vl(auVar49,auVar85._0_16_);
            uVar29 = auVar38._0_4_;
            local_1028._0_4_ = (float)(uVar29 ^ auVar37._0_4_);
            uVar73 = auVar38._4_4_;
            local_1028._4_4_ = (float)(uVar73 ^ auVar37._4_4_);
            uVar27 = auVar38._8_4_;
            local_1028._8_4_ = (float)(uVar27 ^ auVar37._8_4_);
            uVar74 = auVar38._12_4_;
            local_1028._12_4_ = (float)(uVar74 ^ auVar37._12_4_);
            auVar36 = vmulps_avx512vl(auVar36,auVar56);
            auVar40 = vfmadd231ps_avx512vl(auVar36,auVar40,auVar55);
            auVar39 = vfmadd231ps_fma(auVar40,auVar39,auVar54);
            local_1018._0_4_ = (float)(uVar29 ^ auVar39._0_4_);
            local_1018._4_4_ = (float)(uVar73 ^ auVar39._4_4_);
            local_1018._8_4_ = (float)(uVar27 ^ auVar39._8_4_);
            local_1018._12_4_ = (float)(uVar74 ^ auVar39._12_4_);
            auVar39 = auVar86._0_16_;
            uVar14 = vcmpps_avx512vl(local_1028,auVar39,5);
            uVar15 = vcmpps_avx512vl(local_1018,auVar39,5);
            uVar16 = vcmpps_avx512vl(auVar49,auVar39,4);
            auVar75._0_4_ = local_1028._0_4_ + local_1018._0_4_;
            auVar75._4_4_ = local_1028._4_4_ + local_1018._4_4_;
            auVar75._8_4_ = local_1028._8_4_ + local_1018._8_4_;
            auVar75._12_4_ = local_1028._12_4_ + local_1018._12_4_;
            uVar17 = vcmpps_avx512vl(auVar75,local_ff8,2);
            local_fe7 = (byte)uVar14 & (byte)uVar15 & (byte)uVar16 & (byte)uVar17;
            if (local_fe7 != 0) {
              auVar72._0_4_ = auVar53._0_4_ * local_f88._0_4_;
              auVar72._4_4_ = auVar53._4_4_ * local_f88._4_4_;
              auVar72._8_4_ = auVar53._8_4_ * local_f88._8_4_;
              auVar72._12_4_ = auVar53._12_4_ * local_f88._12_4_;
              auVar39 = vfmadd213ps_fma(auVar52,local_f98,auVar72);
              auVar39 = vfmadd213ps_fma(auVar51,local_fa8,auVar39);
              local_1008._0_4_ = (float)(uVar29 ^ auVar39._0_4_);
              local_1008._4_4_ = (float)(uVar73 ^ auVar39._4_4_);
              local_1008._8_4_ = (float)(uVar27 ^ auVar39._8_4_);
              local_1008._12_4_ = (float)(uVar74 ^ auVar39._12_4_);
              uVar70 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar21._4_4_ = uVar70;
              auVar21._0_4_ = uVar70;
              auVar21._8_4_ = uVar70;
              auVar21._12_4_ = uVar70;
              auVar39 = vmulps_avx512vl(local_ff8,auVar21);
              fVar65 = (ray->super_RayK<1>).tfar;
              auVar22._4_4_ = fVar65;
              auVar22._0_4_ = fVar65;
              auVar22._8_4_ = fVar65;
              auVar22._12_4_ = fVar65;
              auVar40 = vmulps_avx512vl(local_ff8,auVar22);
              uVar14 = vcmpps_avx512vl(local_1008,auVar40,2);
              uVar15 = vcmpps_avx512vl(auVar39,local_1008,1);
              local_fe7 = (byte)uVar14 & (byte)uVar15 & local_fe7;
              if (local_fe7 != 0) {
                lVar25 = lVar25 + uVar31;
                auVar3._0_4_ = (ray->super_RayK<1>).tfar;
                auVar3._4_4_ = (ray->super_RayK<1>).mask;
                auVar3._8_4_ = (ray->super_RayK<1>).id;
                auVar3._12_4_ = (ray->super_RayK<1>).flags;
                auVar63 = ZEXT1664(auVar3);
                uVar29 = vextractps_avx(auVar3,1);
                auVar39 = vrcp14ps_avx512vl(local_ff8);
                auVar40 = vfnmadd213ps_avx512vl(local_ff8,auVar39,auVar87._0_16_);
                auVar39 = vfmadd132ps_fma(auVar40,auVar39,auVar39);
                fVar65 = auVar39._0_4_;
                local_fb8._0_4_ = fVar65 * local_1008._0_4_;
                fVar67 = auVar39._4_4_;
                local_fb8._4_4_ = fVar67 * local_1008._4_4_;
                fVar68 = auVar39._8_4_;
                local_fb8._8_4_ = fVar68 * local_1008._8_4_;
                fVar69 = auVar39._12_4_;
                local_fb8._12_4_ = fVar69 * local_1008._12_4_;
                auVar61 = ZEXT1664(local_fb8);
                local_fd8[0] = fVar65 * local_1028._0_4_;
                local_fd8[1] = fVar67 * local_1028._4_4_;
                local_fd8[2] = fVar68 * local_1028._8_4_;
                local_fd8[3] = fVar69 * local_1028._12_4_;
                local_fc8[0] = fVar65 * local_1018._0_4_;
                local_fc8[1] = fVar67 * local_1018._4_4_;
                local_fc8[2] = fVar68 * local_1018._8_4_;
                local_fc8[3] = fVar69 * local_1018._12_4_;
                auVar39 = vblendmps_avx512vl(auVar88._0_16_,local_fb8);
                auVar58._0_4_ =
                     (uint)(local_fe7 & 1) * auVar39._0_4_ |
                     (uint)!(bool)(local_fe7 & 1) * (int)(fVar65 * local_1018._0_4_);
                bVar6 = (bool)(local_fe7 >> 1 & 1);
                auVar58._4_4_ =
                     (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * (int)(fVar67 * local_1018._4_4_);
                bVar6 = (bool)(local_fe7 >> 2 & 1);
                auVar58._8_4_ =
                     (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * (int)(fVar68 * local_1018._8_4_);
                bVar6 = (bool)(local_fe7 >> 3 & 1);
                auVar58._12_4_ =
                     (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * (int)(fVar69 * local_1018._12_4_)
                ;
                auVar39 = vshufps_avx(auVar58,auVar58,0xb1);
                auVar39 = vminps_avx(auVar39,auVar58);
                auVar40 = vshufpd_avx(auVar39,auVar39,1);
                auVar39 = vminps_avx(auVar40,auVar39);
                uVar14 = vcmpps_avx512vl(auVar58,auVar39,0);
                local_117c = (uint)local_fe7;
                bVar26 = local_fe7;
                if (((byte)uVar14 & local_fe7) != 0) {
                  bVar26 = (byte)uVar14 & local_fe7;
                }
                uVar73 = 0;
                for (uVar27 = (uint)bVar26; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                  uVar73 = uVar73 + 1;
                }
                local_1120 = local_1130->scene;
                do {
                  auVar39 = auVar86._0_16_;
                  uVar27 = uVar73 & 0xff;
                  local_10d0 = *(uint *)(lVar25 + 0x120 + (ulong)uVar27 * 4);
                  local_1128 = (local_1120->geometries).items[local_10d0].ptr;
                  if ((local_1128->mask & uVar29) == 0) {
                    bVar26 = ~(byte)(1 << (uVar73 & 0x1f)) & (byte)local_117c;
                    local_10b8 = auVar58;
                  }
                  else {
                    pRVar5 = local_1130->args;
                    local_10b8 = auVar63._0_16_;
                    local_10a8 = auVar61._0_16_;
                    local_1098 = auVar83._0_16_;
                    local_1088 = auVar82._0_16_;
                    local_1078 = auVar81._0_16_;
                    local_1068 = auVar80._0_16_;
                    local_1058 = auVar79._0_16_;
                    local_1048 = auVar78._0_16_;
                    local_1038 = auVar77._0_16_;
                    if (pRVar5->filter == (RTCFilterFunctionN)0x0) {
                      local_1118.context = local_1130->user;
                      if (local_1128->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar28 = (ulong)(uVar27 << 2);
                        fVar65 = *(float *)((long)local_fd8 + uVar28);
                        fVar67 = *(float *)((long)local_fc8 + uVar28);
                        (ray->super_RayK<1>).tfar = *(float *)(local_fb8 + uVar28);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_fa8 + uVar28);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_f98 + uVar28);
                        (ray->Ng).field_0.field_0.z = *(float *)(local_f88 + uVar28);
                        ray->u = fVar65;
                        ray->v = fVar67;
                        ray->primID = *(uint *)(lVar25 + 0x130 + uVar28);
                        ray->geomID = local_10d0;
                        ray->instID[0] = (local_1118.context)->instID[0];
                        ray->instPrimID[0] = (local_1118.context)->instPrimID[0];
                        break;
                      }
                    }
                    else {
                      local_1118.context = local_1130->user;
                    }
                    uVar28 = (ulong)(uVar27 * 4);
                    local_10e8 = *(float *)(local_fa8 + uVar28);
                    local_10e4 = *(undefined4 *)(local_f98 + uVar28);
                    local_10e0 = *(undefined4 *)(local_f88 + uVar28);
                    local_10dc = *(undefined4 *)((long)local_fd8 + uVar28);
                    local_10d8 = *(undefined4 *)((long)local_fc8 + uVar28);
                    local_10d4 = *(undefined4 *)(lVar25 + 0x130 + uVar28);
                    local_10cc = (local_1118.context)->instID[0];
                    local_10c8 = (local_1118.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_fb8 + uVar28);
                    local_1154 = -1;
                    local_1118.valid = &local_1154;
                    local_1118.geometryUserPtr = local_1128->userPtr;
                    local_1118.ray = (RTCRayN *)ray;
                    local_1118.hit = (RTCHitN *)&local_10e8;
                    local_1118.N = 1;
                    if (((local_1128->intersectionFilterN == (RTCFilterFunctionN)0x0) ||
                        ((*local_1128->intersectionFilterN)(&local_1118), *local_1118.valid != 0))
                       && ((pRVar5->filter == (RTCFilterFunctionN)0x0 ||
                           ((((pRVar5->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                              RTC_RAY_QUERY_FLAG_INCOHERENT &&
                             (((local_1128->field_8).field_0x2 & 0x40) == 0)) ||
                            ((*pRVar5->filter)(&local_1118), *local_1118.valid != 0)))))) {
                      (((Vec3f *)((long)local_1118.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_1118.hit;
                      (((Vec3f *)((long)local_1118.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_1118.hit + 4);
                      (((Vec3f *)((long)local_1118.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_1118.hit + 8);
                      *(float *)((long)local_1118.ray + 0x3c) = *(float *)(local_1118.hit + 0xc);
                      local_10b8 = ZEXT416((uint)*(float *)(local_1118.hit + 0x10));
                      *(float *)((long)local_1118.ray + 0x40) = *(float *)(local_1118.hit + 0x10);
                      *(float *)((long)local_1118.ray + 0x44) = *(float *)(local_1118.hit + 0x14);
                      *(float *)((long)local_1118.ray + 0x48) = *(float *)(local_1118.hit + 0x18);
                      *(float *)((long)local_1118.ray + 0x4c) = *(float *)(local_1118.hit + 0x1c);
                      *(float *)((long)local_1118.ray + 0x50) = *(float *)(local_1118.hit + 0x20);
                    }
                    else {
                      (ray->super_RayK<1>).tfar = local_10b8._0_4_;
                    }
                    auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar4._4_4_ = (ray->super_RayK<1>).mask;
                    auVar4._8_4_ = (ray->super_RayK<1>).id;
                    auVar4._12_4_ = (ray->super_RayK<1>).flags;
                    auVar63 = ZEXT1664(auVar4);
                    auVar61 = ZEXT1664(local_10a8);
                    fVar65 = (ray->super_RayK<1>).tfar;
                    auVar23._4_4_ = fVar65;
                    auVar23._0_4_ = fVar65;
                    auVar23._8_4_ = fVar65;
                    auVar23._12_4_ = fVar65;
                    uVar14 = vcmpps_avx512vl(local_10a8,auVar23,2);
                    bVar26 = ~(byte)(1 << (uVar73 & 0x1f)) & (byte)local_117c & (byte)uVar14;
                    uVar29 = vextractps_avx(auVar4,1);
                    auVar77 = ZEXT1664(local_1038);
                    auVar78 = ZEXT1664(local_1048);
                    auVar79 = ZEXT1664(local_1058);
                    auVar80 = ZEXT1664(local_1068);
                    auVar81 = ZEXT1664(local_1078);
                    auVar82 = ZEXT1664(local_1088);
                    auVar83 = ZEXT1664(local_1098);
                    auVar40 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                    auVar84 = ZEXT1664(auVar40);
                    auVar40 = vmovddup_avx512vl(ZEXT816(0x8000000080000000));
                    auVar85 = ZEXT1664(auVar40);
                    auVar39 = vxorps_avx512vl(auVar39,auVar39);
                    auVar86 = ZEXT1664(auVar39);
                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                    auVar87 = ZEXT1664(auVar39);
                    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
                    auVar88 = ZEXT1664(auVar39);
                  }
                  local_117c = (uint)bVar26;
                  if (bVar26 == 0) break;
                  auVar39 = vblendmps_avx512vl(auVar88._0_16_,auVar61._0_16_);
                  auVar58._0_4_ =
                       (uint)(bVar26 & 1) * auVar39._0_4_ |
                       (uint)!(bool)(bVar26 & 1) * local_10b8._0_4_;
                  bVar6 = (bool)(bVar26 >> 1 & 1);
                  auVar58._4_4_ = (uint)bVar6 * auVar39._4_4_ | (uint)!bVar6 * local_10b8._4_4_;
                  bVar6 = (bool)(bVar26 >> 2 & 1);
                  auVar58._8_4_ = (uint)bVar6 * auVar39._8_4_ | (uint)!bVar6 * local_10b8._8_4_;
                  bVar6 = (bool)(bVar26 >> 3 & 1);
                  auVar58._12_4_ = (uint)bVar6 * auVar39._12_4_ | (uint)!bVar6 * local_10b8._12_4_;
                  auVar39 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar39 = vminps_avx(auVar39,auVar58);
                  auVar40 = vshufpd_avx(auVar39,auVar39,1);
                  auVar39 = vminps_avx(auVar40,auVar39);
                  uVar14 = vcmpps_avx512vl(auVar58,auVar39,0);
                  bVar26 = (byte)uVar14 & bVar26;
                  uVar27 = local_117c;
                  if (bVar26 != 0) {
                    uVar27 = (uint)bVar26;
                  }
                  uVar73 = 0;
                  for (; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x80000000) {
                    uVar73 = uVar73 + 1;
                  }
                } while( true );
              }
            }
            local_1150 = local_1150 + 1;
          } while (local_1150 != local_1148);
        }
        fVar65 = (ray->super_RayK<1>).tfar;
        auVar61 = ZEXT1664(CONCAT412(fVar65,CONCAT48(fVar65,CONCAT44(fVar65,fVar65))));
        auVar63 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
      }
    } while (puVar24 != &local_f78);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }